

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O0

void fio_json_on_string(json_parser_s *p,void *start,size_t length)

{
  FIOBJ o;
  size_t size;
  fio_str_info_s local_40;
  FIOBJ local_28;
  FIOBJ str;
  size_t length_local;
  void *start_local;
  json_parser_s *p_local;
  
  str = length;
  length_local = (size_t)start;
  start_local = p;
  o = fiobj_str_buf(length);
  local_28 = o;
  fiobj_obj2cstr(&local_40,o);
  size = fio_json_unescape_str(local_40.data,(char *)length_local,str);
  fiobj_str_resize(o,size);
  fiobj_json_add2parser((fiobj_json_parser_s *)start_local,local_28);
  return;
}

Assistant:

static void fio_json_on_string(json_parser_s *p, void *start, size_t length) {
  FIOBJ str = fiobj_str_buf(length);
  fiobj_str_resize(
      str, fio_json_unescape_str(fiobj_obj2cstr(str).data, start, length));
  fiobj_json_add2parser((fiobj_json_parser_s *)p, str);
}